

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

int __thiscall xray_re::_lzhuf::GetByte(_lzhuf *this)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  
  bVar1 = this->getlen;
  if (bVar1 < 9) {
    uVar2 = this->getbuf;
    sVar5 = this->m_src_pos;
    do {
      bVar3 = bVar1;
      uVar4 = 0xffffffff;
      sVar6 = sVar5;
      if (sVar5 < this->m_src_limit) {
        sVar6 = sVar5 + 1;
        this->m_src_pos = sVar6;
        uVar4 = (uint)this->m_src[sVar5];
      }
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar2 = uVar2 | uVar4 << (8 - bVar3 & 0x1f);
      this->getbuf = uVar2;
      this->getlen = bVar3 + 8;
      sVar5 = sVar6;
      bVar1 = 8;
    } while (bVar3 == 0);
  }
  else {
    uVar2 = this->getbuf;
    bVar3 = bVar1 - 8;
  }
  this->getbuf = uVar2 << 8;
  this->getlen = bVar3;
  return uVar2 >> 8 & 0xff;
}

Assistant:

int _lzhuf::GetByte(void)	/* get one byte */
{
	unsigned i;

	while (getlen <= 8) {
		int c = getc();
		i = (c < 0) ? 0 : c;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 8;
	getlen -= 8;
	return (i & 0xff00) >> 8;
}